

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sockets.c
# Opt level: O2

int socket_buffer_size(int socket_fd,Direction direction)

{
  undefined4 in_EAX;
  int iVar1;
  int buffer_size;
  socklen_t value_size;
  
  _buffer_size = CONCAT44(4,in_EAX);
  iVar1 = getsockopt(socket_fd,1,8 - (uint)(direction == SEND),&buffer_size,&value_size);
  if (iVar1 != -1) {
    return buffer_size;
  }
  throw("Error getting buffer size");
}

Assistant:

int socket_buffer_size(int socket_fd, Direction direction) {
	int return_code;
	int buffer_size;
	socklen_t value_size = sizeof buffer_size;

	// clang-format off
	return_code = getsockopt(
		socket_fd,
		SOL_SOCKET,
		(direction == SEND) ? SO_SNDBUF : SO_RCVBUF,
		&buffer_size,
		&value_size
	);
	// clang-format on

	if (return_code == -1) {
		throw("Error getting buffer size");
	}

	return buffer_size;
}